

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_ssl_client.cpp
# Opt level: O3

uchar __thiscall
bidfx_public_api::tools::OpenSSLClient::InputStreamImpl::ReadByte(InputStreamImpl *this)

{
  uchar uVar1;
  int iVar2;
  uchar *puVar3;
  undefined4 extraout_var;
  char *pcVar4;
  
  puVar3 = (uchar *)operator_new__(1);
  iVar2 = (*(this->super_InputStream)._vptr_InputStream[1])(this,puVar3,1);
  if (CONCAT44(extraout_var,iVar2) != -1) {
    uVar1 = *puVar3;
    operator_delete__(puVar3);
    return uVar1;
  }
  pcVar4 = (char *)__cxa_allocate_exception(0x20);
  std::iostream_category();
  std::ios_base::failure[abi:cxx11]::failure(pcVar4,(error_code *)"Could not read byte");
  __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
              std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

unsigned char OpenSSLClient::InputStreamImpl::ReadByte()
{
    auto* bytes = new unsigned char[1];
    size_t bytes_read = ReadBytes(bytes, 1);
    if (bytes_read == -1)
    {
        throw std::ios_base::failure("Could not read byte");
    }

    unsigned char byte = bytes[0];
    delete[](bytes);
    return byte;
}